

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherInotify::~FileWatcherInotify(FileWatcherInotify *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  iterator end;
  iterator iter;
  FileWatcherInotify *this_local;
  
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherInotify_00166b70;
  (this->super_FileWatcherImpl).mInitOK = false;
  if (this->mThread != (Thread *)0x0) {
    if (this->mThread != (Thread *)0x0) {
      (*this->mThread->_vptr_Thread[1])();
    }
    this->mThread = (Thread *)0x0;
  }
  end = std::
        map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
        ::begin(&this->mWatches);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
       ::end(&this->mWatches);
  while( true ) {
    bVar1 = std::operator!=(&end,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                       (&end);
    if (ppVar2->second != (WatcherInotify *)0x0) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                         (&end);
      if (ppVar2->second != (WatcherInotify *)0x0) {
        (*(ppVar2->second->super_Watcher)._vptr_Watcher[1])();
      }
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator->
                         (&end);
      ppVar2->second = (WatcherInotify *)0x0;
    }
    std::_Rb_tree_iterator<std::pair<const_long,_efsw::WatcherInotify_*>_>::operator++(&end);
  }
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::clear(&this->mWatches);
  if (this->mFD != -1) {
    close(this->mFD);
    this->mFD = -1;
  }
  Mutex::~Mutex(&this->mWatchesLock);
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~map(&this->mRealWatches);
  std::
  map<long,_efsw::WatcherInotify_*,_std::less<long>,_std::allocator<std::pair<const_long,_efsw::WatcherInotify_*>_>_>
  ::~map(&this->mWatches);
  FileWatcherImpl::~FileWatcherImpl(&this->super_FileWatcherImpl);
  return;
}

Assistant:

FileWatcherInotify::~FileWatcherInotify()
{
	mInitOK = false;

	efSAFE_DELETE( mThread );
	
	WatchMap::iterator iter = mWatches.begin();
	WatchMap::iterator end = mWatches.end();

	for(; iter != end; ++iter)
	{
		efSAFE_DELETE( iter->second );
	}

	mWatches.clear();

	if ( mFD != -1 )
	{
		close(mFD);
		mFD = -1;
	}
}